

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddTime.c
# Opt level: O1

DdNode * cuddBddAndAbstractRecurTime
                   (DdManager *manager,DdNode *f,DdNode *g,DdNode *cube,int *pRecCalls,int TimeOut)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  DdNode *pDVar5;
  abctime aVar6;
  DdNode *pDVar7;
  uint *puVar8;
  DdNode *pDVar9;
  uint uVar10;
  uint *puVar11;
  int iVar12;
  int TimeOut_00;
  int TimeOut_01;
  int *piVar13;
  uint index;
  DdNode *pDVar14;
  DdNode *pDVar15;
  DdNode *local_68;
  
  pDVar5 = manager->one;
  pDVar14 = (DdNode *)((ulong)pDVar5 ^ 1);
  if (((((DdNode *)((ulong)g ^ 1) == f) || (pDVar14 == f)) || (pDVar14 == g)) ||
     (pDVar14 = pDVar5, pDVar5 == g && pDVar5 == f)) {
    return pDVar14;
  }
  TimeOut_00 = (int)pRecCalls;
  pDVar14 = (DdNode *)pRecCalls;
  if (pDVar5 != cube) {
    pDVar14 = g;
    if ((f == g || pDVar5 == f) || (pDVar14 = f, pDVar5 == g)) {
      pDVar5 = cuddBddExistAbstractRecur(manager,pDVar14,cube);
      return pDVar5;
    }
    if (g < f) {
      pDVar14 = g;
      g = f;
    }
    f = pDVar14;
    puVar11 = (uint *)((ulong)f & 0xfffffffffffffffe);
    puVar8 = (uint *)((ulong)g & 0xfffffffffffffffe);
    piVar13 = manager->perm;
    uVar1 = piVar13[*puVar11];
    uVar2 = piVar13[*puVar8];
    uVar10 = uVar1;
    if (uVar2 < uVar1) {
      uVar10 = uVar2;
    }
    do {
      uVar3 = piVar13[cube->index];
      if (uVar10 <= uVar3) {
        if (((puVar11[1] != 1) || (puVar8[1] != 1)) &&
           (pDVar14 = cuddCacheLookup(manager,6,f,g,cube), pDVar14 != (DdNode *)0x0)) {
          return pDVar14;
        }
        if ((TimeOut_00 != 0) && (aVar6 = Abc_Clock(), TimeOut_00 < aVar6)) {
          return (DdNode *)0x0;
        }
        piVar13 = (int *)((ulong)pRecCalls & 0xffffffff);
        if (uVar2 < uVar1) {
          index = *puVar8;
          pDVar14 = f;
          local_68 = f;
        }
        else {
          index = *puVar11;
          pDVar14 = *(DdNode **)(puVar11 + 4);
          local_68 = *(DdNode **)(puVar11 + 6);
          if (((ulong)f & 1) != 0) {
            pDVar14 = (DdNode *)((ulong)pDVar14 ^ 1);
            local_68 = (DdNode *)((ulong)local_68 ^ 1);
          }
        }
        pDVar7 = g;
        pDVar9 = g;
        if (uVar2 <= uVar1) {
          pDVar9 = *(DdNode **)(puVar8 + 4);
          pDVar7 = *(DdNode **)(puVar8 + 6);
          if (((ulong)g & 1) != 0) {
            pDVar9 = (DdNode *)((ulong)pDVar9 ^ 1);
            pDVar7 = (DdNode *)((ulong)pDVar7 ^ 1);
          }
        }
        if (uVar3 == uVar10) {
          pDVar15 = (cube->type).kids.T;
          TimeOut_01 = TimeOut_00;
          iVar12 = TimeOut_00;
          pDVar14 = cuddBddAndAbstractRecurTime(manager,pDVar14,pDVar9,pDVar15,piVar13,TimeOut_00);
          if (pDVar14 == (DdNode *)0x0) {
            pDVar5 = (DdNode *)0x0;
            bVar4 = false;
            pDVar14 = (DdNode *)0x0;
          }
          else if (((pDVar14 == pDVar5) || (pDVar14 == local_68)) || (pDVar14 == pDVar7)) {
            if ((puVar11[1] != 1) || (puVar8[1] != 1)) {
              cuddCacheInsert(manager,6,f,g,cube,pDVar14);
            }
            bVar4 = false;
            pDVar5 = (DdNode *)0x0;
          }
          else {
            piVar13 = (int *)(((ulong)pDVar14 & 0xfffffffffffffffe) + 4);
            *piVar13 = *piVar13 + 1;
            pDVar5 = pDVar7;
            if ((pDVar14 == (DdNode *)((ulong)local_68 ^ 1)) ||
               (pDVar5 = local_68, pDVar14 == (DdNode *)((ulong)pDVar7 ^ 1))) {
              TimeOut_00 = iVar12;
              pDVar9 = cuddBddExistAbstractRecur(manager,pDVar5,pDVar15);
            }
            else {
              pDVar9 = cuddBddAndAbstractRecurTime
                                 (manager,local_68,pDVar7,pDVar15,
                                  (int *)((ulong)pRecCalls & 0xffffffff),TimeOut_01);
            }
            if (pDVar9 == (DdNode *)0x0) {
              Cudd_IterDerefBdd(manager,pDVar14);
              pDVar5 = (DdNode *)0x0;
              bVar4 = false;
              pDVar14 = (DdNode *)0x0;
            }
            else if (pDVar14 == pDVar9) {
              piVar13 = (int *)(((ulong)pDVar14 & 0xfffffffffffffffe) + 4);
              *piVar13 = *piVar13 + -1;
              bVar4 = true;
              pDVar5 = pDVar14;
            }
            else {
              piVar13 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
              *piVar13 = *piVar13 + 1;
              pDVar7 = cuddBddAndRecurTime(manager,(DdNode *)((ulong)pDVar14 ^ 1),
                                           (DdNode *)((ulong)pDVar9 ^ 1),
                                           (int *)((ulong)pRecCalls & 0xffffffff),TimeOut_00);
              if (pDVar7 == (DdNode *)0x0) {
                Cudd_IterDerefBdd(manager,pDVar14);
                Cudd_IterDerefBdd(manager,pDVar9);
                pDVar5 = (DdNode *)0x0;
                pDVar14 = (DdNode *)0x0;
              }
              else {
                pDVar5 = (DdNode *)((ulong)pDVar7 ^ 1);
                piVar13 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
                *piVar13 = *piVar13 + 1;
                Cudd_DelayedDerefBdd(manager,pDVar14);
                Cudd_DelayedDerefBdd(manager,pDVar9);
                piVar13 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
                *piVar13 = *piVar13 + -1;
              }
              bVar4 = pDVar7 != (DdNode *)0x0;
            }
          }
          if (!bVar4) {
            return pDVar14;
          }
          goto LAB_00805fd6;
        }
        pDVar14 = cuddBddAndAbstractRecurTime(manager,pDVar14,pDVar9,cube,piVar13,TimeOut_00);
        if (pDVar14 == (DdNode *)0x0) {
          return (DdNode *)0x0;
        }
        pDVar15 = (DdNode *)((ulong)pDVar14 & 0xfffffffffffffffe);
        pDVar15->ref = pDVar15->ref + 1;
        pDVar9 = cuddBddAndAbstractRecurTime(manager,local_68,pDVar7,cube,piVar13,TimeOut_00);
        if (pDVar9 == (DdNode *)0x0) goto LAB_00805f9b;
        pDVar5 = pDVar14;
        if (pDVar14 != pDVar9) {
          piVar13 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
          *piVar13 = *piVar13 + 1;
          if (((ulong)pDVar14 & 1) == 0) {
            pDVar5 = cuddUniqueInter(manager,index,pDVar14,pDVar9);
            if (pDVar5 != (DdNode *)0x0) {
LAB_00805ed1:
              piVar13 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
              *piVar13 = *piVar13 + -1;
              goto LAB_00805ed7;
            }
          }
          else {
            pDVar5 = cuddUniqueInter(manager,index,pDVar15,(DdNode *)((ulong)pDVar9 ^ 1));
            if (pDVar5 != (DdNode *)0x0) {
              pDVar5 = (DdNode *)((ulong)pDVar5 ^ 1);
              goto LAB_00805ed1;
            }
          }
          Cudd_IterDerefBdd(manager,pDVar14);
          pDVar14 = pDVar9;
LAB_00805f9b:
          Cudd_IterDerefBdd(manager,pDVar14);
          return (DdNode *)0x0;
        }
LAB_00805ed7:
        pDVar15->ref = pDVar15->ref - 1;
LAB_00805fd6:
        if ((puVar11[1] == 1) && (puVar8[1] == 1)) {
          return pDVar5;
        }
        cuddCacheInsert(manager,6,f,g,cube,pDVar5);
        return pDVar5;
      }
      cube = (cube->type).kids.T;
      pDVar14 = g;
    } while (cube != pDVar5);
  }
  pDVar5 = cuddBddAndRecurTime(manager,f,g,(int *)((ulong)pRecCalls & 0xffffffff),(int)pDVar14);
  return pDVar5;
}

Assistant:

DdNode *
cuddBddAndAbstractRecurTime(
  DdManager * manager,
  DdNode * f,
  DdNode * g,
  DdNode * cube,
  int * pRecCalls,
  int TimeOut)
{
    DdNode *F, *ft, *fe, *G, *gt, *ge;
    DdNode *one, *zero, *r, *t, *e;
    unsigned int topf, topg, topcube, top, index;

    statLine(manager);
    one = DD_ONE(manager);
    zero = Cudd_Not(one);

    /* Terminal cases. */
    if (f == zero || g == zero || f == Cudd_Not(g)) return(zero);
    if (f == one && g == one)	return(one);

    if (cube == one) {
	return(cuddBddAndRecurTime(manager, f, g, pRecCalls, TimeOut));
    }
    if (f == one || f == g) {
	return(cuddBddExistAbstractRecur(manager, g, cube));
    }
    if (g == one) {
	return(cuddBddExistAbstractRecur(manager, f, cube));
    }
    /* At this point f, g, and cube are not constant. */

    if (f > g) { /* Try to increase cache efficiency. */
	DdNode *tmp = f;
	f = g;
	g = tmp;
    }

    /* Here we can skip the use of cuddI, because the operands are known
    ** to be non-constant.
    */
    F = Cudd_Regular(f);
    G = Cudd_Regular(g);
    topf = manager->perm[F->index];
    topg = manager->perm[G->index];
    top = ddMin(topf, topg);
    topcube = manager->perm[cube->index];

    while (topcube < top) {
	cube = cuddT(cube);
	if (cube == one) {
	    return(cuddBddAndRecurTime(manager, f, g, pRecCalls, TimeOut));
	}
	topcube = manager->perm[cube->index];
    }
    /* Now, topcube >= top. */

    /* Check cache. */
    if (F->ref != 1 || G->ref != 1) {
	r = cuddCacheLookup(manager, DD_BDD_AND_ABSTRACT_TAG, f, g, cube);
	if (r != NULL) {
	    return(r);
	}
    }

//    if ( TimeOut && ((*pRecCalls)++ % CHECK_FACTOR) == 0 && TimeOut < Abc_Clock() )
    if ( TimeOut && Abc_Clock() > TimeOut )
        return NULL;

    if (topf == top) {
	index = F->index;
	ft = cuddT(F);
	fe = cuddE(F);
	if (Cudd_IsComplement(f)) {
	    ft = Cudd_Not(ft);
	    fe = Cudd_Not(fe);
	}
    } else {
	index = G->index;
	ft = fe = f;
    }

    if (topg == top) {
	gt = cuddT(G);
	ge = cuddE(G);
	if (Cudd_IsComplement(g)) {
	    gt = Cudd_Not(gt);
	    ge = Cudd_Not(ge);
	}
    } else {
	gt = ge = g;
    }

    if (topcube == top) {	/* quantify */
	DdNode *Cube = cuddT(cube);
	t = cuddBddAndAbstractRecurTime(manager, ft, gt, Cube, pRecCalls, TimeOut);
	if (t == NULL) return(NULL);
	/* Special case: 1 OR anything = 1. Hence, no need to compute
	** the else branch if t is 1. Likewise t + t * anything == t.
	** Notice that t == fe implies that fe does not depend on the
	** variables in Cube. Likewise for t == ge.
	*/
	if (t == one || t == fe || t == ge) {
	    if (F->ref != 1 || G->ref != 1)
		cuddCacheInsert(manager, DD_BDD_AND_ABSTRACT_TAG,
				f, g, cube, t);
	    return(t);
	}
	cuddRef(t);
	/* Special case: t + !t * anything == t + anything. */
	if (t == Cudd_Not(fe)) {
	    e = cuddBddExistAbstractRecur(manager, ge, Cube);
	} else if (t == Cudd_Not(ge)) {
	    e = cuddBddExistAbstractRecur(manager, fe, Cube);
	} else {
	    e = cuddBddAndAbstractRecurTime(manager, fe, ge, Cube, pRecCalls, TimeOut);
	}
	if (e == NULL) {
	    Cudd_IterDerefBdd(manager, t);
	    return(NULL);
	}
	if (t == e) {
	    r = t;
	    cuddDeref(t);
	} else {
	    cuddRef(e);
	    r = cuddBddAndRecurTime(manager, Cudd_Not(t), Cudd_Not(e), pRecCalls, TimeOut);
	    if (r == NULL) {
		Cudd_IterDerefBdd(manager, t);
		Cudd_IterDerefBdd(manager, e);
		return(NULL);
	    }
	    r = Cudd_Not(r);
	    cuddRef(r);
	    Cudd_DelayedDerefBdd(manager, t);
	    Cudd_DelayedDerefBdd(manager, e);
	    cuddDeref(r);
	}
    } else {
	t = cuddBddAndAbstractRecurTime(manager, ft, gt, cube, pRecCalls, TimeOut);
	if (t == NULL) return(NULL);
	cuddRef(t);
	e = cuddBddAndAbstractRecurTime(manager, fe, ge, cube, pRecCalls, TimeOut);
	if (e == NULL) {
	    Cudd_IterDerefBdd(manager, t);
	    return(NULL);
	}
	if (t == e) {
	    r = t;
	    cuddDeref(t);
	} else {
	    cuddRef(e);
	    if (Cudd_IsComplement(t)) {
		r = cuddUniqueInter(manager, (int) index,
				    Cudd_Not(t), Cudd_Not(e));
		if (r == NULL) {
		    Cudd_IterDerefBdd(manager, t);
		    Cudd_IterDerefBdd(manager, e);
		    return(NULL);
		}
		r = Cudd_Not(r);
	    } else {
		r = cuddUniqueInter(manager,(int)index,t,e);
		if (r == NULL) {
		    Cudd_IterDerefBdd(manager, t);
		    Cudd_IterDerefBdd(manager, e);
		    return(NULL);
		}
	    }
	    cuddDeref(e);
	    cuddDeref(t);
	}
    }

    if (F->ref != 1 || G->ref != 1)
	cuddCacheInsert(manager, DD_BDD_AND_ABSTRACT_TAG, f, g, cube, r);
    return (r);

}